

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int moveto_op_comp(lyxp_set *set1,lyxp_set *set2,char *op,lyd_node *cur_node,lys_module *param_5,
                  int options)

{
  longdouble lVar1;
  char cVar2;
  lyxp_set_type lVar3;
  longdouble lVar4;
  int iVar5;
  LY_ERR *pLVar6;
  lyxp_set_type lVar7;
  bool bVar8;
  
LAB_0016a9ac:
  do {
    lVar7 = set1->type;
    lVar3 = set2->type;
    if (LYXP_SET_NODE_SET < lVar7 && lVar7 == lVar3) {
      cVar2 = *op;
      if (cVar2 == '!') {
LAB_0016ab26:
        if (lVar7 == LYXP_SET_NUMBER) {
          bVar8 = (set1->val).num != (set2->val).num;
          goto LAB_0016ab95;
        }
        if (lVar7 != LYXP_SET_BOOLEAN) {
          iVar5 = ly_strequal_((set1->val).str,(set2->val).str);
          bVar8 = iVar5 == 0;
          goto LAB_0016ab95;
        }
        bVar8 = (set1->val).bool == (set2->val).bool;
      }
      else {
        if (cVar2 != '=') {
          if (lVar7 == LYXP_SET_BOOLEAN) goto LAB_0016aa2e;
          if (lVar7 == LYXP_SET_STRING) goto LAB_0016aa03;
          if (cVar2 == '!') goto LAB_0016ab26;
          if (cVar2 != '=') {
            if (lVar7 != LYXP_SET_NUMBER) {
              pLVar6 = ly_errno_location();
              *pLVar6 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                     ,0x15a1);
              return -1;
            }
            lVar1 = (set2->val).num;
            lVar4 = (set1->val).num;
            if (cVar2 == '<') {
              lVar4 = lVar1;
              lVar1 = (set1->val).num;
            }
            if (op[1] == '=') {
              bVar8 = lVar1 <= lVar4;
            }
            else {
              bVar8 = lVar1 < lVar4;
            }
            goto LAB_0016ab95;
          }
        }
        if (lVar7 == LYXP_SET_NUMBER) {
          bVar8 = (set1->val).num == (set2->val).num;
          goto LAB_0016ab95;
        }
        if (lVar7 == LYXP_SET_BOOLEAN) {
          bVar8 = (set1->val).bool == (set2->val).bool;
          goto LAB_0016ab95;
        }
        iVar5 = ly_strequal_((set1->val).str,(set2->val).str);
        bVar8 = iVar5 == 0;
      }
      bVar8 = !bVar8;
LAB_0016ab95:
      set_fill_boolean(set1,(uint)bVar8);
      lyxp_set_cast(set2,LYXP_SET_EMPTY,cur_node,param_5,options);
      return 0;
    }
    if (LYXP_SET_NODE_SET < lVar7) {
      if (lVar7 == LYXP_SET_BOOLEAN) {
LAB_0016aa2e:
        if ((LYXP_SET_BOOLEAN < lVar3) || (lVar3 == LYXP_SET_SNODE_SET)) goto LAB_0016aa38;
      }
      else {
        if (lVar7 == LYXP_SET_STRING) goto LAB_0016aa03;
LAB_0016aa38:
        if (((*op != '=') && (*op != '!')) ||
           (lVar3 != LYXP_SET_BOOLEAN && lVar7 != LYXP_SET_BOOLEAN)) {
          iVar5 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
          if (iVar5 != 0) {
            return -1;
          }
          lVar7 = LYXP_SET_NUMBER;
          goto LAB_0016aaeb;
        }
      }
      lyxp_set_cast(set1,LYXP_SET_BOOLEAN,cur_node,param_5,options);
      lyxp_set_cast(set2,LYXP_SET_BOOLEAN,cur_node,param_5,options);
      goto LAB_0016a9ac;
    }
LAB_0016aa03:
    if (((LYXP_SET_STRING < lVar3) || ((0x23U >> (lVar3 & 0x1f) & 1) == 0)) ||
       (lVar3 == LYXP_SET_STRING && lVar7 == LYXP_SET_STRING)) {
      if ((lVar7 < LYXP_SET_NUMBER) && (lVar7 != LYXP_SET_SNODE_SET)) goto LAB_0016aa2e;
      goto LAB_0016aa38;
    }
    iVar5 = lyxp_set_cast(set1,LYXP_SET_STRING,cur_node,param_5,options);
    if (iVar5 != 0) {
      return -1;
    }
    lVar7 = LYXP_SET_STRING;
LAB_0016aaeb:
    iVar5 = lyxp_set_cast(set2,lVar7,cur_node,param_5,options);
    if (iVar5 != 0) {
      return -1;
    }
  } while( true );
}

Assistant:

static int
moveto_op_comp(struct lyxp_set *set1, struct lyxp_set *set2, const char *op, struct lyd_node *cur_node,
               struct lys_module *local_mod, int options)
{
    /*
     * NODE SET + NODE SET = STRING + STRING  /1 STRING, 2 STRING
     * NODE SET + STRING = STRING + STRING    /1 STRING (2 STRING)
     * NODE SET + NUMBER = NUMBER + NUMBER    /1 NUMBER (2 NUMBER)
     * NODE SET + BOOLEAN = BOOLEAN + BOOLEAN /1 BOOLEAN (2 BOOLEAN)
     * STRING + NODE SET = STRING + STRING    /(1 STRING) 2 STRING
     * NUMBER + NODE SET = NUMBER + NUMBER    /(1 NUMBER) 2 NUMBER
     * BOOLEAN + NODE SET = BOOLEAN + BOOLEAN /(1 BOOLEAN) 2 BOOLEAN
     *
     * '=' or '!='
     * BOOLEAN + BOOLEAN
     * BOOLEAN + STRING = BOOLEAN + BOOLEAN   /(1 BOOLEAN) 2 BOOLEAN
     * BOOLEAN + NUMBER = BOOLEAN + BOOLEAN   /(1 BOOLEAN) 2 BOOLEAN
     * STRING + BOOLEAN = BOOLEAN + BOOLEAN   /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + BOOLEAN = BOOLEAN + BOOLEAN   /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + NUMBER
     * NUMBER + STRING = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER      /1 NUMBER (2 NUMBER)
     * STRING + STRING
     *
     * '<=', '<', '>=', '>'
     * NUMBER + NUMBER
     * BOOLEAN + BOOLEAN = NUMBER + NUMBER    /1 NUMBER, 2 NUMBER
     * BOOLEAN + NUMBER = NUMBER + NUMBER     /1 NUMBER (2 NUMBER)
     * BOOLEAN + STRING = NUMBER + NUMBER     /1 NUMBER, 2 NUMBER
     * NUMBER + STRING = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     * STRING + STRING = NUMBER + NUMBER      /1 NUMBER, 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER      /1 NUMBER (2 NUMBER)
     * NUMBER + BOOLEAN = NUMBER + NUMBER     /(1 NUMBER) 2 NUMBER
     * STRING + BOOLEAN = NUMBER + NUMBER     /(1 NUMBER) 2 NUMBER
     */
    int result;

    /* we can evaluate it immediately */
    if ((set1->type == set2->type) && (set1->type != LYXP_SET_EMPTY) && (set1->type != LYXP_SET_NODE_SET)
            && (((op[0] == '=') || (op[0] == '!')) || ((set1->type != LYXP_SET_BOOLEAN) && (set1->type != LYXP_SET_STRING)))) {

        /* compute result */
        if (op[0] == '=') {
            if (set1->type == LYXP_SET_BOOLEAN) {
                result = (set1->val.bool == set2->val.bool);
            } else if (set1->type == LYXP_SET_NUMBER) {
                result = (set1->val.num == set2->val.num);
            } else {
                result = (ly_strequal(set1->val.str, set2->val.str, 0));
            }
        } else if (op[0] == '!') {
            if (set1->type == LYXP_SET_BOOLEAN) {
                result = (set1->val.bool != set2->val.bool);
            } else if (set1->type == LYXP_SET_NUMBER) {
                result = (set1->val.num != set2->val.num);
            } else {
                result = (!ly_strequal(set1->val.str, set2->val.str, 0));
            }
        } else {
            if (set1->type != LYXP_SET_NUMBER) {
                LOGINT;
                return -1;
            }

            if (op[0] == '<') {
                if (op[1] == '=') {
                    result = (set1->val.num <= set2->val.num);
                } else {
                    result = (set1->val.num < set2->val.num);
                }
            } else {
                if (op[1] == '=') {
                    result = (set1->val.num >= set2->val.num);
                } else {
                    result = (set1->val.num > set2->val.num);
                }
            }
        }

        /* assign result */
        if (result) {
            set_fill_boolean(set1, 1);
        } else {
            set_fill_boolean(set1, 0);
        }

        lyxp_set_cast(set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return EXIT_SUCCESS;
    }

    /* convert first */
    if (((set1->type == LYXP_SET_NODE_SET) || (set1->type == LYXP_SET_EMPTY) || (set1->type == LYXP_SET_STRING))
            && ((set2->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_EMPTY) || (set2->type == LYXP_SET_STRING))
            && ((set1->type != LYXP_SET_STRING) || (set2->type != LYXP_SET_STRING))) {
        if (lyxp_set_cast(set1, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }
        if (lyxp_set_cast(set2, LYXP_SET_STRING, cur_node, local_mod, options)) {
            return -1;
        }

    } else if ((((set1->type == LYXP_SET_NODE_SET) || (set1->type == LYXP_SET_EMPTY) || (set1->type == LYXP_SET_BOOLEAN))
            && ((set2->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_EMPTY) || (set2->type == LYXP_SET_BOOLEAN)))
            || (((op[0] == '=') || (op[0] == '!')) && ((set1->type == LYXP_SET_BOOLEAN) || (set2->type == LYXP_SET_BOOLEAN)))) {
        lyxp_set_cast(set1, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        lyxp_set_cast(set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);

    } else {
        if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
        if (lyxp_set_cast(set2, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
    }

    /* now we can evaluate */
    return moveto_op_comp(set1, set2, op, cur_node, local_mod, options);
}